

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O2

void __thiscall
OpenMD::GofAngle2::GofAngle2
          (GofAngle2 *this,SimInfo *info,string *filename,string *sele1,string *sele2,int nangleBins
          )

{
  ostream *poVar1;
  long lVar2;
  ulong __new_size;
  uint i;
  ulong uVar3;
  string paramString;
  stringstream params;
  string local_1e0;
  SelectionManager *local_1c0;
  undefined1 local_1b8 [392];
  
  RadialDistrFunc::RadialDistrFunc
            (&this->super_RadialDistrFunc,info,filename,sele1,sele2,nangleBins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofAngle2_002ecf10;
  this->doSele3_ = false;
  SelectionManager::SelectionManager(&this->seleMan3_,info);
  local_1c0 = &this->seleMan3_;
  SelectionEvaluator::SelectionEvaluator(&this->evaluator3_,info);
  (this->selectionScript3_)._M_dataplus._M_p = (pointer)&(this->selectionScript3_).field_2;
  (this->selectionScript3_)._M_string_length = 0;
  (this->selectionScript3_).field_2._M_local_buf[0] = '\0';
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->avgGofr_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,"Radial Distribution Function",(allocator<char> *)&local_1e0);
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&local_1e0,filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                 &local_1e0,".gto");
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_1e0);
  this->deltaCosAngle_ = 2.0 / (double)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar1 = std::operator<<((ostream *)(local_1b8 + 0x10)," nAngleBins = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,", deltaCosAngle = ");
  std::ostream::_M_insert<double>(this->deltaCosAngle_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.paramString_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->histogram_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->avgGofr_,(ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
  lVar2 = 0;
  for (uVar3 = 0; __new_size = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_,
      uVar3 < __new_size; uVar3 = uVar3 + 1) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this->histogram_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar2),__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               ((long)&(((this->avgGofr_).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data + lVar2),
               (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_);
    lVar2 = lVar2 + 0x18;
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

GofAngle2::GofAngle2(SimInfo* info, const std::string& filename,
                       const std::string& sele1, const std::string& sele2,
                       int nangleBins) :
      RadialDistrFunc(info, filename, sele1, sele2, nangleBins),
      doSele3_(false), seleMan3_(info), evaluator3_(info) {
    setAnalysisType("Radial Distribution Function");
    setOutputName(getPrefix(filename) + ".gto");

    deltaCosAngle_ = 2.0 / nBins_;

    std::stringstream params;
    params << " nAngleBins = " << nBins_
           << ", deltaCosAngle = " << deltaCosAngle_;
    const std::string paramString = params.str();
    setParameterString(paramString);

    histogram_.resize(nBins_);
    avgGofr_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      avgGofr_[i].resize(nBins_);
    }
  }